

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::QuadsSetSubsetFree
          (CGraphics_Threaded *this,float x0,float y0,float x1,float y1,float x2,float y2,float x3,
          float y3,int TextureIndex)

{
  int iVar1;
  undefined4 uVar2;
  int in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  float fVar3;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  undefined4 in_XMM6_Da;
  undefined4 in_XMM7_Da;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))();
  if ((1 < iVar1) && (-1 < in_ESI)) {
    TilesetFallbackSystem
              ((CGraphics_Threaded *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
               (int)((ulong)in_RDI >> 0x20));
  }
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x1201a8);
  *(undefined4 *)(in_RDI + 0x1200e4) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x1200e8) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 0x1200f0) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 0x1200f4) = in_XMM3_Da;
  *(undefined4 *)(in_RDI + 0x1200fc) = in_XMM4_Da;
  *(undefined4 *)(in_RDI + 0x120100) = in_XMM5_Da;
  *(undefined4 *)(in_RDI + 0x120108) = in_XMM6_Da;
  *(undefined4 *)(in_RDI + 0x12010c) = in_XMM7_Da;
  fVar3 = (float)in_ESI;
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))();
  fVar3 = (fVar3 + 0.5) / (256.0 / (float)iVar1);
  *(float *)(in_RDI + 0x120110) = fVar3;
  *(float *)(in_RDI + 0x120104) = fVar3;
  *(float *)(in_RDI + 0x1200f8) = fVar3;
  *(float *)(in_RDI + 0x1200ec) = fVar3;
  uVar2 = 3;
  if (in_ESI < 0) {
    uVar2 = 2;
  }
  *(undefined4 *)(in_RDI + 0x38) = uVar2;
  return;
}

Assistant:

void CGraphics_Threaded::QuadsSetSubsetFree(
	float x0, float y0, float x1, float y1,
	float x2, float y2, float x3, float y3, int TextureIndex)
{
	// tileset fallback system
	if(m_pBackend->GetTextureArraySize() > 1 && TextureIndex >= 0)
		TilesetFallbackSystem(TextureIndex);

	m_State.m_TextureArrayIndex = m_TextureArrayIndex;

	m_aTexture[0].u = x0; m_aTexture[0].v = y0;
	m_aTexture[1].u = x1; m_aTexture[1].v = y1;
	m_aTexture[2].u = x2; m_aTexture[2].v = y2;
	m_aTexture[3].u = x3; m_aTexture[3].v = y3;

	m_aTexture[0].i = m_aTexture[1].i = m_aTexture[2].i = m_aTexture[3].i = (0.5f + TextureIndex) / (256.0f/m_pBackend->GetTextureArraySize());
	m_State.m_Dimension = (TextureIndex < 0) ? 2 : 3;
}